

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O2

string * RRStepTypeToStr_abi_cxx11_(string *__return_storage_ptr__,RRStepType step)

{
  logic_error *this;
  allocator *paVar1;
  char *pcVar2;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  switch(step) {
  case I:
    pcVar2 = "I";
    paVar1 = &local_11;
    break;
  case J:
    pcVar2 = "J";
    paVar1 = &local_12;
    break;
  case K:
    pcVar2 = "K";
    paVar1 = &local_13;
    break;
  case L:
    pcVar2 = "L";
    paVar1 = &local_14;
    break;
  default:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Missing RRStepType");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string RRStepTypeToStr(RRStepType step)
{
    switch(step)
    {
        case RRStepType::I:
            return "I";
        case RRStepType::J:
            return "J";
        case RRStepType::K:
            return "K";
        case RRStepType::L:
            return "L";
        default:
            throw std::logic_error("Missing RRStepType");
    }
}